

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLContextState.cpp
# Opt level: O0

void __thiscall Diligent::GLContextState::SetFillMode(GLContextState *this,FILL_MODE FillMode)

{
  undefined *puVar1;
  undefined4 uVar2;
  Char *Message;
  undefined8 uVar3;
  undefined1 local_70 [8];
  string _msg;
  undefined1 local_40 [8];
  string msg;
  GLenum err;
  GLenum PolygonMode;
  FILL_MODE FillMode_local;
  GLContextState *this_local;
  
  if (((this->m_Caps).IsFillModeSelectionSupported & 1U) == 0) {
    if (FillMode == FILL_MODE_WIREFRAME) {
      FormatString<char[53]>
                ((string *)local_70,
                 (char (*) [53])"Wireframe fill mode is not supported on this device\n");
      puVar1 = DebugMessageCallback;
      if (DebugMessageCallback != (undefined *)0x0) {
        uVar3 = std::__cxx11::string::c_str();
        (*(code *)puVar1)(1,uVar3,0);
      }
      std::__cxx11::string::~string((string *)local_70);
    }
  }
  else if ((this->m_RSState).FillMode != FillMode) {
    uVar2 = 0x1b02;
    if (FillMode == FILL_MODE_WIREFRAME) {
      uVar2 = 0x1b01;
    }
    glPolygonMode(0x408,uVar2);
    msg.field_2._12_4_ = glGetError();
    if (msg.field_2._12_4_ != 0) {
      LogError<false,char[27],char[17],unsigned_int>
                (false,"SetFillMode",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x24b,(char (*) [27])"Failed to set polygon mode",
                 (char (*) [17])"\nGL Error Code: ",(uint *)(msg.field_2._M_local_buf + 0xc));
      FormatString<char[6]>((string *)local_40,(char (*) [6])0xe8e72e);
      Message = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (Message,"SetFillMode",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x24b);
      std::__cxx11::string::~string((string *)local_40);
    }
    (this->m_RSState).FillMode = FillMode;
  }
  return;
}

Assistant:

void GLContextState::SetFillMode(FILL_MODE FillMode)
{
    if (m_Caps.IsFillModeSelectionSupported)
    {
        if (m_RSState.FillMode != FillMode)
        {
            if (glPolygonMode != nullptr)
            {
                GLenum PolygonMode = FillMode == FILL_MODE_WIREFRAME ? GL_LINE : GL_FILL;
                glPolygonMode(GL_FRONT_AND_BACK, PolygonMode);
                DEV_CHECK_GL_ERROR("Failed to set polygon mode");
            }
            else
            {
                if (FillMode != FILL_MODE_SOLID)
                    LOG_ERROR("This API/device only supports solid fill mode");
            }

            m_RSState.FillMode = FillMode;
        }
    }
    else
    {
        if (FillMode == FILL_MODE_WIREFRAME)
            LOG_WARNING_MESSAGE("Wireframe fill mode is not supported on this device\n");
    }
}